

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

int16_t labpack_read_i16(labpack_reader_t *reader)

{
  _Bool _Var1;
  int16_t local_12;
  int16_t value;
  labpack_reader_t *reader_local;
  
  if (reader == (labpack_reader_t *)0x0) {
    __assert_fail("reader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                  ,0xdc,"int16_t labpack_read_i16(labpack_reader_t *)");
  }
  local_12 = 0;
  _Var1 = labpack_reader_is_ok(reader);
  if (_Var1) {
    local_12 = mpack_expect_i16(reader->decoder);
    labpack_reader_check_decoder(reader);
  }
  return local_12;
}

Assistant:

int16_t
labpack_read_i16(labpack_reader_t* reader)
{
    assert(reader);
    int16_t value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_i16(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}